

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O2

void __thiscall
cornelich::excerpt_appender::set_last_written_index
          (excerpt_appender *this,int64_t cycle,int64_t index_count,int64_t index_position)

{
  atomic_int_fast64_t *paVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = (index_position >> 3) +
          (cycle << ((byte)this->m_chronicle->m_entries_for_cycle_bits & 0x3f)) +
          (index_count << ((byte)this->m_chronicle->m_index_block_longs_bits & 0x3f));
  this->m_last_written_index = lVar3;
  do {
    lVar2 = (this->m_chronicle->m_last_written_index).super___atomic_base<long>._M_i;
    if (lVar3 <= lVar2) {
      return;
    }
    paVar1 = &this->m_chronicle->m_last_written_index;
    LOCK();
    bVar4 = lVar2 == (paVar1->super___atomic_base<long>)._M_i;
    if (bVar4) {
      (paVar1->super___atomic_base<long>)._M_i = lVar3;
    }
    UNLOCK();
  } while (!bVar4);
  return;
}

Assistant:

void excerpt_appender::set_last_written_index(std::int64_t cycle, std::int64_t index_count, std::int64_t index_position)
{
    std::int64_t last_written_index = index_from(cycle, index_count, index_position);
    m_last_written_index = last_written_index;
    while(true)
    {
        std::int64_t lwi = m_chronicle.last_written_index();
        if(lwi >= last_written_index || m_chronicle.m_last_written_index.compare_exchange_weak(lwi, last_written_index))
            break;
    }
}